

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

QList<QAccessibleInterface_*> * __thiscall
QAccessibleList::selectedCells
          (QList<QAccessibleInterface_*> *__return_storage_ptr__,QAccessibleList *this)

{
  QModelIndex *pQVar1;
  qsizetype qVar2;
  int iVar3;
  int iVar4;
  QObject *object;
  QAbstractItemView *this_00;
  QItemSelectionModel *pQVar5;
  QListView *this_01;
  parameter_type t;
  QModelIndexList *__range1;
  undefined1 *asize;
  long lVar6;
  long lVar7;
  P _a;
  long in_FS_OFFSET;
  QArrayDataPointer<QModelIndex> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  object = (QObject *)QAccessibleTable::view(&this->super_QAccessibleTable);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QAccessibleInterface **)0x0;
  (__return_storage_ptr__->d).size = 0;
  this_00 = (QAbstractItemView *)QAccessibleTable::view(&this->super_QAccessibleTable);
  pQVar5 = QAbstractItemView::selectionModel(this_00);
  if (pQVar5 != (QItemSelectionModel *)0x0) {
    iVar3 = (**(code **)(*(long *)&this->super_QAccessibleTable + 0x58))(this);
    if (iVar3 != 0) {
      this_01 = QtPrivate::qobject_cast_helper<QListView_const*,QObject>(object);
      iVar3 = QListView::modelColumn(this_01);
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
      QAbstractItemView::selectionModel((QAbstractItemView *)object);
      QItemSelectionModel::selectedIndexes();
      qVar2 = local_58.size;
      iVar4 = (**(code **)(*(long *)&this->super_QAccessibleTable + 0x60))(this);
      asize = (undefined1 *)(long)iVar4;
      if (qVar2 < iVar4) {
        asize = (undefined1 *)qVar2;
      }
      QList<QAccessibleInterface_*>::reserve(__return_storage_ptr__,(qsizetype)asize);
      pQVar1 = local_58.ptr;
      lVar6 = local_58.size * 0x18;
      for (lVar7 = 0; lVar6 - lVar7 != 0; lVar7 = lVar7 + 0x18) {
        if (*(int *)((long)&pQVar1->c + lVar7) == iVar3) {
          t = (parameter_type)
              (**(code **)(*(long *)&this->super_QAccessibleTable + 0x100))
                        (this,*(undefined4 *)((long)&pQVar1->r + lVar7));
          QList<QAccessibleInterface_*>::append(__return_storage_ptr__,t);
        }
      }
      QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QAccessibleInterface *> QAccessibleList::selectedCells() const
{
    QAbstractItemView *theView = view();
    QList<QAccessibleInterface*> cells;
    if (!view()->selectionModel() || columnCount() == 0)
        return cells;
    const QListView *listView = qobject_cast<const QListView*>(theView);
    const int modelColumn = listView->modelColumn();
    const QModelIndexList selectedIndexes = theView->selectionModel()->selectedIndexes();
    cells.reserve(qMin(selectedIndexes.size(), rowCount()));
    for (const QModelIndex &index : selectedIndexes)
        if (index.column() == modelColumn) {
            cells.append(child(index.row()));
        }
    return cells;
}